

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

int testing::internal::AppropriateResolution<double>(double val)

{
  double dVar1;
  double divfor6;
  double mulfor6;
  int full;
  double val_local;
  
  val_local = val;
  if (val < 0.0) {
    val_local = -val;
  }
  if (1000000.0 <= val_local) {
    if (val_local < 10000000000.0) {
      divfor6 = 1.0;
      if (val_local < 1000000000.0) {
        if (val_local < 100000000.0) {
          if (val_local < 10000000.0) {
            if (1000000.0 <= val_local) {
              divfor6 = 10.0;
            }
          }
          else {
            divfor6 = 100.0;
          }
        }
        else {
          divfor6 = 1000.0;
        }
      }
      else {
        divfor6 = 10000.0;
      }
      dVar1 = (double)(int)(val_local / divfor6 + 0.5) * divfor6;
      if ((dVar1 == val_local) && (!NAN(dVar1) && !NAN(val_local))) {
        return 6;
      }
    }
  }
  else {
    mulfor6 = 10000000000.0;
    if (val_local < 100000.0) {
      if (val_local < 10000.0) {
        if (val_local < 1000.0) {
          if (val_local < 100.0) {
            if (val_local < 10.0) {
              if (val_local < 1.0) {
                if (val_local < 0.1) {
                  if (val_local < 0.01) {
                    if (val_local < 0.001) {
                      if (0.0001 <= val_local) {
                        mulfor6 = 1000000000.0;
                      }
                    }
                    else {
                      mulfor6 = 100000000.0;
                    }
                  }
                  else {
                    mulfor6 = 10000000.0;
                  }
                }
                else {
                  mulfor6 = 1000000.0;
                }
              }
              else {
                mulfor6 = 100000.0;
              }
            }
            else {
              mulfor6 = 10000.0;
            }
          }
          else {
            mulfor6 = 1000.0;
          }
        }
        else {
          mulfor6 = 100.0;
        }
      }
      else {
        mulfor6 = 10.0;
      }
    }
    else {
      mulfor6 = 1.0;
    }
    dVar1 = (double)(int)(val_local * mulfor6 + 0.5) / mulfor6;
    if ((dVar1 == val_local) && (!NAN(dVar1) && !NAN(val_local))) {
      return 6;
    }
  }
  return 0x11;
}

Assistant:

int AppropriateResolution(FloatType val) {
  int full = std::numeric_limits<FloatType>::max_digits10;
  if (val < 0) val = -val;

#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wfloat-equal"
#endif
  if (val < 1000000) {
    FloatType mulfor6 = 1e10;
    // Without these static casts, the template instantiation for float would
    // fail to compile when -Wdouble-promotion is enabled, as the arithmetic and
    // comparison logic would promote floats to doubles.
    if (val >= static_cast<FloatType>(100000.0)) {  // 100,000 to 999,999
      mulfor6 = 1.0;
    } else if (val >= static_cast<FloatType>(10000.0)) {
      mulfor6 = 1e1;
    } else if (val >= static_cast<FloatType>(1000.0)) {
      mulfor6 = 1e2;
    } else if (val >= static_cast<FloatType>(100.0)) {
      mulfor6 = 1e3;
    } else if (val >= static_cast<FloatType>(10.0)) {
      mulfor6 = 1e4;
    } else if (val >= static_cast<FloatType>(1.0)) {
      mulfor6 = 1e5;
    } else if (val >= static_cast<FloatType>(0.1)) {
      mulfor6 = 1e6;
    } else if (val >= static_cast<FloatType>(0.01)) {
      mulfor6 = 1e7;
    } else if (val >= static_cast<FloatType>(0.001)) {
      mulfor6 = 1e8;
    } else if (val >= static_cast<FloatType>(0.0001)) {
      mulfor6 = 1e9;
    }
    if (static_cast<FloatType>(static_cast<int32_t>(
            val * mulfor6 + (static_cast<FloatType>(0.5)))) /
            mulfor6 ==
        val)
      return 6;
  } else if (val < static_cast<FloatType>(1e10)) {
    FloatType divfor6 = static_cast<FloatType>(1.0);
    if (val >= static_cast<FloatType>(1e9)) {  // 1,000,000,000 to 9,999,999,999
      divfor6 = 10000;
    } else if (val >=
               static_cast<FloatType>(1e8)) {  // 100,000,000 to 999,999,999
      divfor6 = 1000;
    } else if (val >=
               static_cast<FloatType>(1e7)) {  // 10,000,000 to 99,999,999
      divfor6 = 100;
    } else if (val >= static_cast<FloatType>(1e6)) {  // 1,000,000 to 9,999,999
      divfor6 = 10;
    }
    if (static_cast<FloatType>(static_cast<int32_t>(
            val / divfor6 + (static_cast<FloatType>(0.5)))) *
            divfor6 ==
        val)
      return 6;
  }
#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
  return full;
}